

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void StoreLevelStats(void)

{
  OneLevel *pOVar1;
  int iVar2;
  int iVar3;
  OneLevel *pOVar4;
  int iVar5;
  DThinker *pDVar6;
  long lVar7;
  ulong uVar8;
  TThinkerIterator<AActor> it;
  
  if ((gamestate == GS_LEVEL) && ((level.flags2._3_1_ & 0x10) == 0)) {
    lVar7 = 0x18;
    uVar8 = 0;
    while ((uVar8 < LevelData.Count &&
           (iVar5 = FString::CompareNoCase
                              ((FString *)((long)&(LevelData.Array)->totalkills + lVar7),
                               &level.MapName), iVar5 != 0))) {
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    }
    if (LevelData.Count == (uint)uVar8) {
      TArray<OneLevel,_OneLevel>::Reserve(&LevelData,1);
      FString::operator=((FString *)((long)&(LevelData.Array)->totalkills + lVar7),&level.MapName);
    }
    pOVar4 = LevelData.Array;
    iVar3 = level.killed_monsters;
    iVar2 = level.found_secrets;
    iVar5 = level.total_secrets;
    pOVar1 = LevelData.Array + uVar8;
    pOVar1->totalkills = level.total_monsters;
    pOVar1->killcount = iVar3;
    pOVar1->totalsecrets = iVar5;
    pOVar1->secretcount = iVar2;
    pOVar4[uVar8].leveltime = (int)(((long)level.maptime * 0x62) / 100);
    TThinkerIterator<AActor>::TThinkerIterator
              ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,0x80);
    iVar5 = 0;
    while (pDVar6 = FThinkerIterator::Next(&it.super_FThinkerIterator,false),
          pDVar6 != (DThinker *)0x0) {
      if (((ulong)pDVar6[7].PrevThinker & 0x40000000000000) != 0) {
        iVar5 = iVar5 + (uint)(0 < *(int *)((long)&pDVar6[9].super_DObject._vptr_DObject + 4));
      }
    }
    if (iVar5 == 0) {
      LevelData.Array[uVar8].killcount = LevelData.Array[uVar8].totalkills;
    }
  }
  return;
}

Assistant:

static void StoreLevelStats()
{
	unsigned int i;

	if (gamestate != GS_LEVEL) return;

	if (!(level.flags2&LEVEL2_NOSTATISTICS))	// don't consider maps that were excluded from statistics
	{
		for(i=0;i<LevelData.Size();i++)
		{
			if (!LevelData[i].Levelname.CompareNoCase(level.MapName)) break;
		}
		if (i==LevelData.Size())
		{
			LevelData.Reserve(1);
			LevelData[i].Levelname = level.MapName;
		}
		LevelData[i].totalkills = level.total_monsters;
		LevelData[i].killcount = level.killed_monsters;
		LevelData[i].totalsecrets = level.total_secrets;
		LevelData[i].secretcount = level.found_secrets;
		LevelData[i].leveltime = AdjustTics(level.maptime);

		// Check for living monsters. On some maps it can happen
		// that the counter misses some. 
		TThinkerIterator<AActor> it;
		AActor *ac;
		int mc = 0;

		while ((ac = it.Next()))
		{
			if ((ac->flags & MF_COUNTKILL) && ac->health > 0) mc++;
		}
		if (mc == 0) LevelData[i].killcount = LevelData[i].totalkills;
	}
}